

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_allocator.h
# Opt level: O1

pointer __thiscall
cppcms::impl::
basic_allocator<cppcms::impl::shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>_>
::allocate(basic_allocator<cppcms::impl::shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>_>
           *this,size_type cnt,const_pointer param_2)

{
  pointer pmVar1;
  undefined8 *puVar2;
  
  pmVar1 = (pointer)shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
                    ::malloc((shmem_allocator<cppcms::impl::mem_cache<cppcms::impl::process_settings>,_cppcms::impl::process_settings::process_memory>
                              *)this,cnt * 0xe8);
  if (pmVar1 != (pointer)0x0) {
    return pmVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = booster::log::logger::instance;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

pointer allocate(size_type cnt, std::allocator<void>::const_pointer = 0) const
	{
		void *memory=self().malloc(cnt*sizeof(T));
		if(!memory) {
			throw std::bad_alloc();
		}
		return (pointer)memory;
	}